

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int EXRNumLevels(EXRImage *exr_image)

{
  int iVar1;
  
  if (exr_image == (EXRImage *)0x0) {
    return 0;
  }
  iVar1 = 1;
  if (exr_image->images == (uchar **)0x0) {
    iVar1 = 0;
    do {
      exr_image = exr_image->next_level;
      iVar1 = iVar1 + 1;
    } while (exr_image != (TEXRImage *)0x0);
  }
  return iVar1;
}

Assistant:

int EXRNumLevels(const EXRImage* exr_image) {
  if (exr_image == NULL) return 0;
  if(exr_image->images) return 1; // scanlines
  int levels = 1;
  const EXRImage* level_image = exr_image;
  while((level_image = level_image->next_level)) ++levels;
  return levels;
}